

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeCPSInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  DVar1 = MCDisassembler_Fail;
  if ((Insn & 0x10020) != 0) {
    return DVar1;
  }
  uVar4 = Insn >> 0x12 & 3;
  if (uVar4 != 1 && (Insn & 0xff00000) == 0x1000000) {
    uVar2 = Insn >> 6 & 7;
    uVar3 = Insn & 0x1f;
    if ((Insn >> 0x11 & 1) == 0 || uVar4 == 0) {
      if (uVar4 == 0 || (Insn >> 0x11 & 1) != 0) {
        MCInst_setOpcode(Inst,0x56);
        MCOperand_CreateImm0(Inst,(ulong)uVar3);
        if ((Insn >> 0x11 & 1) == 0 || uVar4 != 0) {
          return MCDisassembler_SoftFail;
        }
      }
      else {
        MCInst_setOpcode(Inst,0x57);
        MCOperand_CreateImm0(Inst,(ulong)uVar4);
        MCOperand_CreateImm0(Inst,(ulong)uVar2);
        uVar2 = uVar3;
      }
      DVar1 = (uint)(uVar2 == 0) * 2 + MCDisassembler_SoftFail;
    }
    else {
      MCInst_setOpcode(Inst,0x58);
      MCOperand_CreateImm0(Inst,(ulong)uVar4);
      MCOperand_CreateImm0(Inst,(ulong)uVar2);
      MCOperand_CreateImm0(Inst,(ulong)uVar3);
      DVar1 = MCDisassembler_Success;
    }
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeCPSInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned imod = fieldFromInstruction_4(Insn, 18, 2);
	unsigned M = fieldFromInstruction_4(Insn, 17, 1);
	unsigned iflags = fieldFromInstruction_4(Insn, 6, 3);
	unsigned mode = fieldFromInstruction_4(Insn, 0, 5);

	DecodeStatus S = MCDisassembler_Success;

	// This decoder is called from multiple location that do not check
	// the full encoding is valid before they do.
	if (fieldFromInstruction_4(Insn, 5, 1) != 0 ||
			fieldFromInstruction_4(Insn, 16, 1) != 0 ||
			fieldFromInstruction_4(Insn, 20, 8) != 0x10)
		return MCDisassembler_Fail;

	// imod == '01' --> UNPREDICTABLE
	// NOTE: Even though this is technically UNPREDICTABLE, we choose to
	// return failure here.  The '01' imod value is unprintable, so there's
	// nothing useful we could do even if we returned UNPREDICTABLE.

	if (imod == 1) return MCDisassembler_Fail;

	if (imod && M) {
		MCInst_setOpcode(Inst, ARM_CPS3p);
		MCOperand_CreateImm0(Inst, imod);
		MCOperand_CreateImm0(Inst, iflags);
		MCOperand_CreateImm0(Inst, mode);
	} else if (imod && !M) {
		MCInst_setOpcode(Inst, ARM_CPS2p);
		MCOperand_CreateImm0(Inst, imod);
		MCOperand_CreateImm0(Inst, iflags);
		if (mode) S = MCDisassembler_SoftFail;
	} else if (!imod && M) {
		MCInst_setOpcode(Inst, ARM_CPS1p);
		MCOperand_CreateImm0(Inst, mode);
		if (iflags) S = MCDisassembler_SoftFail;
	} else {
		// imod == '00' && M == '0' --> UNPREDICTABLE
		MCInst_setOpcode(Inst, ARM_CPS1p);
		MCOperand_CreateImm0(Inst, mode);
		S = MCDisassembler_SoftFail;
	}

	return S;
}